

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::addFrameRotationConstraint
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *constraintValue)

{
  bool bVar1;
  index_type iVar2;
  MatrixView<const_double> *in_RDX;
  MatrixView<const_double> *in_RSI;
  int expected_rotation_rows;
  int expected_rotation_cols;
  int expected_transform_rows;
  int expected_transform_cols;
  MatrixView<const_double> *in_stack_fffffffffffffe18;
  MatrixView<const_double> *in_stack_fffffffffffffe20;
  MatrixView<const_double> *in_stack_fffffffffffffe48;
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffffe50;
  Rotation local_188 [120];
  MatrixFixSize local_110 [128];
  Transform local_90 [96];
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  MatrixView<const_double> *local_18;
  
  local_24 = 4;
  local_28 = 4;
  local_2c = 3;
  local_30 = 3;
  local_18 = in_RSI;
  iVar2 = MatrixView<const_double>::rows(in_RDX);
  if ((iVar2 == 4) && (iVar2 = MatrixView<const_double>::cols(in_RDX), iVar2 == 4)) {
    MatrixView<const_double>::MatrixView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    MatrixFixSize<4U,_4U>::MatrixFixSize(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    iDynTree::Transform::Transform(local_90,local_110);
    bVar1 = addFrameRotationConstraint
                      ((InverseKinematics *)in_stack_fffffffffffffe20,
                       (string *)in_stack_fffffffffffffe18,(Transform *)0x16a535);
    return bVar1;
  }
  iVar2 = MatrixView<const_double>::rows(in_RDX);
  if ((iVar2 == 3) && (iVar2 = MatrixView<const_double>::cols(in_RDX), iVar2 == 3)) {
    MatrixView<const_double>::MatrixView(local_18,in_stack_fffffffffffffe18);
    iDynTree::Rotation::Rotation(local_188,&stack0xfffffffffffffe48);
    bVar1 = addFrameRotationConstraint
                      ((InverseKinematics *)local_18,(string *)in_stack_fffffffffffffe18,
                       (Rotation *)0x16a5a2);
    return bVar1;
  }
  iDynTree::reportError
            ("InverseKinematics","addFrameRotationConstraint","Wrong size in input constraintValue")
  ;
  return false;
}

Assistant:

bool InverseKinematics::addFrameRotationConstraint(const std::string& frameName,
                                                         iDynTree::MatrixView<const double> constraintValue)
      {
          constexpr int expected_transform_cols = 4;
          constexpr int expected_transform_rows = 4;
          constexpr int expected_rotation_cols = 3;
          constexpr int expected_rotation_rows = 3;

          if ((constraintValue.rows() == expected_transform_rows)
              && (constraintValue.cols() == expected_transform_cols))
          {
              return this->addFrameRotationConstraint(frameName, Transform(constraintValue));
          }

          if ((constraintValue.rows() == expected_rotation_rows)
              && (constraintValue.cols() == expected_rotation_cols))
          {
              return this->addFrameRotationConstraint(frameName, Rotation(constraintValue));
          }

          reportError("InverseKinematics",
                      "addFrameRotationConstraint",
                      "Wrong size in input constraintValue");
          return false;
      }